

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::initialize(OpenGLRenderer *this)

{
  GLint GVar1;
  char *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  uchar *puVar5;
  void *pvVar6;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  int local_b8;
  int local_b4;
  GLint s;
  GLint d;
  GLint a;
  GLint b;
  GLint g;
  GLint r;
  GLint maxTexSize;
  GLint samples;
  char *extensions;
  undefined1 local_88 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> attrsV;
  char *local_58;
  undefined1 local_50 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> attrsVT;
  float data [8];
  OpenGLRenderer *this_local;
  
  attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  glGenBuffers(1,&this->m_texCoordBuffer);
  glBindBuffer(0x8892,this->m_texCoordBuffer);
  glBufferData(0x8892,0x20,
               &attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x88e4);
  glBindBuffer(0x8892,0);
  glGenBuffers(1,&this->m_vertexBuffer);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_50);
  local_58 = "aV";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_50,&local_58);
  attrsV.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_1115c;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_50,
             (value_type *)
             &attrsV.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_88);
  extensions = "aV";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_88,&extensions);
  pcVar2 = openglrenderer_vsh_texture();
  pcVar3 = openglrenderer_fsh_texture();
  OpenGLShaderProgram::initialize
            (&(this->prog_texture).super_OpenGLShaderProgram,pcVar2,pcVar3,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_50);
  GVar1 = OpenGLShaderProgram::resolve(&(this->prog_texture).super_OpenGLShaderProgram,"m");
  (this->prog_texture).matrix = GVar1;
  pcVar2 = openglrenderer_vsh_texture();
  pcVar3 = openglrenderer_fsh_texture_bgra();
  OpenGLShaderProgram::initialize
            (&(this->prog_texture_bgr).super_OpenGLShaderProgram,pcVar2,pcVar3,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_50);
  GVar1 = OpenGLShaderProgram::resolve(&(this->prog_texture).super_OpenGLShaderProgram,"m");
  (this->prog_texture_bgr).matrix = GVar1;
  pcVar2 = openglrenderer_vsh_texture();
  pcVar3 = openglrenderer_fsh_texture_alpha();
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)&this->prog_alphaTexture,pcVar2,pcVar3,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_50);
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_alphaTexture,"m");
  (this->prog_alphaTexture).super_Program.matrix = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_alphaTexture,"alpha");
  (this->prog_alphaTexture).alpha = GVar1;
  pcVar2 = openglrenderer_vsh_solid();
  pcVar3 = openglrenderer_fsh_solid();
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)&this->prog_solid,pcVar2,pcVar3,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_88);
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_solid,"m");
  (this->prog_solid).super_Program.matrix = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_solid,"color");
  (this->prog_solid).color = GVar1;
  pcVar2 = openglrenderer_vsh_texture();
  pcVar3 = openglrenderer_fsh_texture_colorfilter();
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)&this->prog_colorFilter,pcVar2,pcVar3,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_50);
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_solid,"m");
  (this->prog_colorFilter).super_Program.matrix = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_colorFilter,"CM");
  (this->prog_colorFilter).colorMatrix = GVar1;
  pcVar2 = openglrenderer_vsh_blur();
  pcVar3 = openglrenderer_fsh_blur();
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)&this->prog_blur,pcVar2,pcVar3,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_50);
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_blur,"m");
  (this->prog_blur).super_Program.matrix = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_blur,"dims");
  (this->prog_blur).dims = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_blur,"radius");
  (this->prog_blur).radius = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_blur,"sigma");
  (this->prog_blur).sigma = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_blur,"step");
  (this->prog_blur).step = GVar1;
  pcVar2 = openglrenderer_vsh_blur();
  pcVar3 = openglrenderer_fsh_shadow();
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)&this->prog_shadow,pcVar2,pcVar3,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_50);
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_shadow,"m");
  (this->prog_shadow).super_BlurProgram.super_Program.matrix = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_shadow,"dims");
  (this->prog_shadow).super_BlurProgram.dims = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_shadow,"radius");
  (this->prog_shadow).super_BlurProgram.radius = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_shadow,"sigma");
  (this->prog_shadow).super_BlurProgram.sigma = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_shadow,"step");
  (this->prog_shadow).super_BlurProgram.step = GVar1;
  GVar1 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_shadow,"color");
  (this->prog_shadow).color = GVar1;
  _maxTexSize = (char *)glGetString(0x1f03);
  pcVar2 = strstr(_maxTexSize,"GL_ARB_framebuffer_sRGB");
  if (pcVar2 != (char *)0x0) {
    this->field_0x1f8 = this->field_0x1f8 & 0xfb | 4;
  }
  if ((initialize::logged & 1U) == 0) {
    initialize::logged = true;
    glGetIntegerv(0xd33,&g);
    glGetIntegerv(0x80a9,&r);
    glGetIntegerv(0xd52,&b);
    glGetIntegerv(0xd53,&a);
    glGetIntegerv(0xd54,&d);
    glGetIntegerv(0xd55,&s);
    glGetIntegerv(0xd56,&local_b4);
    glGetIntegerv(0xd57,&local_b8);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_d8);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4,"OpenGL");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_d8);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_f8);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4," - Renderer .........: ");
    puVar5 = (uchar *)glGetString(0x1f01);
    poVar4 = std::operator<<(poVar4,puVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_f8);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_118);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4," - Version ..........: ");
    puVar5 = (uchar *)glGetString(0x1f02);
    poVar4 = std::operator<<(poVar4,puVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_118);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_138);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4," - R/G/B/A ..........: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,b);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,a);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,d);
    poVar4 = std::operator<<(poVar4," ");
    pvVar6 = (void *)std::ostream::operator<<(poVar4,s);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_138);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_158);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4," - Depth/Stencil ....: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_b4);
    poVar4 = std::operator<<(poVar4," ");
    pvVar6 = (void *)std::ostream::operator<<(poVar4,local_b8);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_158);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_178);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4," - Samples ..........: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar4,r);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_178);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_198);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4," - Max Texture Size .: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar4,g);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_198);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_1b8);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4," - SRGB Rendering ...: ");
    pcVar2 = "no";
    if ((*(uint *)&this->field_0x1f8 >> 2 & 1) != 0) {
      pcVar2 = "yes";
    }
    poVar4 = std::operator<<(poVar4,pcVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1b8);
    poVar4 = std::operator<<((ostream *)&std::cerr,"I [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_1d8);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4," - Extensions .......: ");
    puVar5 = (uchar *)glGetString(0x1f03);
    poVar4 = std::operator<<(poVar4,puVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d8);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_88);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_50);
  return;
}

Assistant:

inline void OpenGLRenderer::initialize()
{
    {   // Create a texture coordinate buffer
        const float data[] = { 0, 0, 0, 1, 1, 0, 1, 1 };
        glGenBuffers(1, &m_texCoordBuffer);
        glBindBuffer(GL_ARRAY_BUFFER, m_texCoordBuffer);
        glBufferData(GL_ARRAY_BUFFER, 8 * sizeof(float), data, GL_STATIC_DRAW);
        glBindBuffer(GL_ARRAY_BUFFER, 0);
    }

    // Create the vertex coordinate buffer
    glGenBuffers(1, &m_vertexBuffer);

    std::vector<const char *> attrsVT;
    attrsVT.push_back("aV");
    attrsVT.push_back("aT");

    std::vector<const char *> attrsV;
    attrsV.push_back("aV");

    // Default texture shader
    prog_texture.initialize(openglrenderer_vsh_texture(), openglrenderer_fsh_texture(), attrsVT);
    prog_texture.matrix = prog_texture.resolve("m");

    // BGRA texture shader
    prog_texture_bgr.initialize(openglrenderer_vsh_texture(), openglrenderer_fsh_texture_bgra(), attrsVT);
    prog_texture_bgr.matrix = prog_texture.resolve("m");

    // Alpha texture shader
    prog_alphaTexture.initialize(openglrenderer_vsh_texture(), openglrenderer_fsh_texture_alpha(), attrsVT);
    prog_alphaTexture.matrix = prog_alphaTexture.resolve("m");
    prog_alphaTexture.alpha = prog_alphaTexture.resolve("alpha");

    // Solid color shader...
    prog_solid.initialize(openglrenderer_vsh_solid(), openglrenderer_fsh_solid(), attrsV);
    prog_solid.matrix = prog_solid.resolve("m");
    prog_solid.color = prog_solid.resolve("color");

    // Color filter shader..
    prog_colorFilter.initialize(openglrenderer_vsh_texture(), openglrenderer_fsh_texture_colorfilter(), attrsVT);
    prog_colorFilter.matrix = prog_solid.resolve("m");
    prog_colorFilter.colorMatrix = prog_colorFilter.resolve("CM");

    // Blur shader
    prog_blur.initialize(openglrenderer_vsh_blur(), openglrenderer_fsh_blur(), attrsVT);
    prog_blur.matrix = prog_blur.resolve("m");
    prog_blur.dims = prog_blur.resolve("dims");
    prog_blur.radius = prog_blur.resolve("radius");
    prog_blur.sigma = prog_blur.resolve("sigma");
    prog_blur.step = prog_blur.resolve("step");

    // Shadow shader
    prog_shadow.initialize(openglrenderer_vsh_blur(), openglrenderer_fsh_shadow(), attrsVT);
    prog_shadow.matrix = prog_shadow.resolve("m");
    prog_shadow.dims = prog_shadow.resolve("dims");
    prog_shadow.radius = prog_shadow.resolve("radius");
    prog_shadow.sigma = prog_shadow.resolve("sigma");
    prog_shadow.step = prog_shadow.resolve("step");
    prog_shadow.color = prog_shadow.resolve("color");

    // Using srgb for everything needs a bit more thought as it results in
    // really washed out colors for rectangles and image textures.
    const char *extensions = (const char *) glGetString(GL_EXTENSIONS);
    if (std::strstr(extensions, "GL_ARB_framebuffer_sRGB")) {
        m_srgb = true;
        // glEnable(GL_FRAMEBUFFER_SRGB);
    }

#ifdef RENGINE_LOG_INFO
    static bool logged = false;
    if (!logged) {
        logged = true;
        GLint samples, maxTexSize;
        GLint r, g, b, a, d, s;
        glGetIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);
        glGetIntegerv(GL_SAMPLES, &samples);
        glGetIntegerv(GL_RED_BITS, &r);
        glGetIntegerv(GL_GREEN_BITS, &g);
        glGetIntegerv(GL_BLUE_BITS, &b);
        glGetIntegerv(GL_ALPHA_BITS, &a);
        glGetIntegerv(GL_DEPTH_BITS, &d);
        glGetIntegerv(GL_STENCIL_BITS, &s);
        logi << "OpenGL" << std::endl;
        logi << " - Renderer .........: " << glGetString(GL_RENDERER) << std::endl;
        logi << " - Version ..........: " << glGetString(GL_VERSION) << std::endl;
        logi << " - R/G/B/A ..........: " << r << " " << g << " " << b << " " << a << std::endl;
        logi << " - Depth/Stencil ....: " << d << " " << s << std::endl;
        logi << " - Samples ..........: " << samples << std::endl;
        logi << " - Max Texture Size .: " << maxTexSize << std::endl;
        logi << " - SRGB Rendering ...: " << (m_srgb ? "yes" : "no") << std::endl;
        logi << " - Extensions .......: " << glGetString(GL_EXTENSIONS) << std::endl;
    }
#endif

}